

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isValidForDPIArg(Type *this)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *this_00;
  long lVar5;
  
  while( true ) {
    pTVar4 = getCanonicalType(this);
    bVar2 = isIntegral(pTVar4);
    if (bVar2) {
      return true;
    }
    bVar2 = isFloating(pTVar4);
    if (bVar2) {
      return true;
    }
    bVar2 = isString(pTVar4);
    if (bVar2) {
      return true;
    }
    bVar2 = isCHandle(pTVar4);
    if (bVar2) break;
    bVar2 = isVoid(pTVar4);
    if (bVar2) {
      return true;
    }
    if (((pTVar4->super_Symbol).kind | Definition) != DPIOpenArrayType) {
      bVar2 = isUnpackedStruct(pTVar4);
      if (!bVar2) {
        return false;
      }
      pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
      pTVar4 = pTVar4[1].canonical;
      lVar5 = 0;
      do {
        bVar2 = (long)pTVar4 << 3 == lVar5;
        if (bVar2) {
          return bVar2;
        }
        this_00 = DeclaredType::getType
                            ((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar5) + 0x40));
        bVar3 = isValidForDPIArg(this_00);
        lVar5 = lVar5 + 8;
      } while (bVar3);
      return bVar2;
    }
    this = getArrayElementType(pTVar4);
  }
  return true;
}

Assistant:

bool Type::isValidForDPIArg() const {
    auto& ct = getCanonicalType();
    if (ct.isIntegral() || ct.isFloating() || ct.isString() || ct.isCHandle() || ct.isVoid())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType ||
        ct.kind == SymbolKind::DPIOpenArrayType) {
        return ct.getArrayElementType()->isValidForDPIArg();
    }

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!field->getType().isValidForDPIArg())
                return false;
        }
        return true;
    }

    return false;
}